

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_iov.c
# Opt level: O0

void mk_iov_free_marked(mk_iov *mk_io)

{
  int iVar1;
  int local_14;
  int limit;
  int i;
  mk_iov *mk_io_local;
  
  iVar1 = mk_io->buf_idx;
  for (local_14 = 0; local_14 < iVar1; local_14 = local_14 + 1) {
    mk_mem_free(mk_io->buf_to_free[local_14]);
  }
  mk_io->iov_idx = 0;
  mk_io->buf_idx = 0;
  mk_io->total_len = 0;
  return;
}

Assistant:

void mk_iov_free_marked(struct mk_iov *mk_io)
{
    int i, limit = 0;

    limit = mk_io->buf_idx;

    for (i = 0; i < limit; i++) {

#ifdef DEBUG_IOV
        printf("\nDEBUG IOV :: going free (idx: %i/%i): %s", i,
               limit, mk_io->buf_to_free[i]);
        fflush(stdout);
#endif
        mk_mem_free(mk_io->buf_to_free[i]);
    }

    mk_io->iov_idx = 0;
    mk_io->buf_idx = 0;
    mk_io->total_len = 0;
}